

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll.cpp
# Opt level: O0

int ep_server_start_loop(char *port,void *userdata)

{
  int sfd_00;
  char *pcVar1;
  char *local_88;
  char *local_80;
  char *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  undefined1 local_38 [8];
  epoll_event event;
  int epoll;
  int res;
  int sfd;
  void *userdata_local;
  char *port_local;
  
  init_settings();
  sfd_00 = create_and_bind(port);
  if (sfd_00 == -1) {
    pcVar1 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/epoll/epoll.cpp"
                     ,0x2f);
    if (pcVar1 == (char *)0x0) {
      pcVar1 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/epoll/epoll.cpp"
                       ,0x5c);
      if (pcVar1 == (char *)0x0) {
        local_48 = 
        "/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/epoll/epoll.cpp"
        ;
      }
      else {
        local_48 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/epoll/epoll.cpp"
                           ,0x5c);
        local_48 = local_48 + 1;
      }
      local_40 = local_48;
    }
    else {
      local_40 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/epoll/epoll.cpp"
                         ,0x2f);
      local_40 = local_40 + 1;
    }
    printf("\x1b[31mERROR: %s: %s: %d: cannot create socket!\x1b[m\n",local_40,
           "ep_server_start_loop",0xa3);
    sk_on_global_error();
  }
  else {
    event.data.u64._4_4_ = make_socket_non_block(sfd_00);
    if (event.data.u64._4_4_ == -1) {
      pcVar1 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/epoll/epoll.cpp"
                       ,0x2f);
      if (pcVar1 == (char *)0x0) {
        pcVar1 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/epoll/epoll.cpp"
                         ,0x5c);
        if (pcVar1 == (char *)0x0) {
          local_58 = 
          "/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/epoll/epoll.cpp"
          ;
        }
        else {
          local_58 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/epoll/epoll.cpp"
                             ,0x5c);
          local_58 = local_58 + 1;
        }
        local_50 = local_58;
      }
      else {
        local_50 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/epoll/epoll.cpp"
                           ,0x2f);
        local_50 = local_50 + 1;
      }
      printf("\x1b[31mERROR: %s: %s: %d: connot set flags!\x1b[m\n",local_50,"ep_server_start_loop",
             0xaa);
      sk_on_global_error();
    }
    else {
      event.data.u64._4_4_ = listen(sfd_00,0x1000);
      if (event.data.u64._4_4_ == -1) {
        pcVar1 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/epoll/epoll.cpp"
                         ,0x2f);
        if (pcVar1 == (char *)0x0) {
          pcVar1 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/epoll/epoll.cpp"
                           ,0x5c);
          if (pcVar1 == (char *)0x0) {
            local_68 = 
            "/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/epoll/epoll.cpp"
            ;
          }
          else {
            local_68 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/epoll/epoll.cpp"
                               ,0x5c);
            local_68 = local_68 + 1;
          }
          local_60 = local_68;
        }
        else {
          local_60 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/epoll/epoll.cpp"
                             ,0x2f);
          local_60 = local_60 + 1;
        }
        printf("\x1b[31mERROR: %s: %s: %d: cannot listen!\x1b[m\n",local_60,"ep_server_start_loop",
               0xb1);
        sk_on_global_error();
      }
      else {
        event.data.fd = epoll_create(1);
        if (event.data.fd == -1) {
          pcVar1 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/epoll/epoll.cpp"
                           ,0x2f);
          if (pcVar1 == (char *)0x0) {
            pcVar1 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/epoll/epoll.cpp"
                             ,0x5c);
            if (pcVar1 == (char *)0x0) {
              local_78 = 
              "/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/epoll/epoll.cpp"
              ;
            }
            else {
              local_78 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/epoll/epoll.cpp"
                                 ,0x5c);
              local_78 = local_78 + 1;
            }
            local_70 = local_78;
          }
          else {
            local_70 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/epoll/epoll.cpp"
                               ,0x2f);
            local_70 = local_70 + 1;
          }
          printf("\x1b[31mERROR: %s: %s: %d: cannot create epoll!\x1b[m\n",local_70,
                 "ep_server_start_loop",0xb8);
          sk_on_global_error();
        }
        else {
          local_38._0_4_ = 0x80000005;
          local_38._4_4_ = sfd_00;
          event.data.u64._4_4_ = epoll_ctl(event.data.fd,1,sfd_00,(epoll_event *)local_38);
          if (event.data.u64._4_4_ != -1) {
            sk_on_start(event.data.fd,userdata);
            do {
              loop_once(event.data.fd,sfd_00,(epoll_event *)local_38);
            } while( true );
          }
          pcVar1 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/epoll/epoll.cpp"
                           ,0x2f);
          if (pcVar1 == (char *)0x0) {
            pcVar1 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/epoll/epoll.cpp"
                             ,0x5c);
            if (pcVar1 == (char *)0x0) {
              local_88 = 
              "/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/epoll/epoll.cpp"
              ;
            }
            else {
              local_88 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/epoll/epoll.cpp"
                                 ,0x5c);
              local_88 = local_88 + 1;
            }
            local_80 = local_88;
          }
          else {
            local_80 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/epoll/epoll.cpp"
                               ,0x2f);
            local_80 = local_80 + 1;
          }
          printf("\x1b[31mERROR: %s: %s: %d: can not add event to epoll!\x1b[m\n",local_80,
                 "ep_server_start_loop",0xc1);
          sk_on_global_error();
        }
      }
    }
  }
  return -1;
}

Assistant:

int ep_server_start_loop(const char *port, void *userdata)
{
    init_settings();

    int sfd, res, epoll;
    struct epoll_event event;

    sfd = create_and_bind(port);
    if (sfd == -1) {
        LOGE("cannot create socket!");
        sk_on_global_error();
        return -1;
    }

    res = make_socket_non_block(sfd);
    if (res == -1) {
        LOGE("connot set flags!");
        sk_on_global_error();
        return -1;
    }

    res = listen(sfd, SOMAXCONN);
    if (res == -1) {
        LOGE("cannot listen!");
        sk_on_global_error();
        return -1;
    }

    epoll = epoll_create(1);
    if (epoll == -1) {
        LOGE("cannot create epoll!");
        sk_on_global_error();
        return -1;
    }

    event.events  = EPOLLIN | EPOLLOUT | EPOLLET;
    event.data.fd = sfd;
    res = epoll_ctl(epoll, EPOLL_CTL_ADD, sfd, &event);
    if (res == -1) {
        LOGE("can not add event to epoll!");
        sk_on_global_error();
        return -1;
    }

    sk_on_start(epoll, userdata);

    for (;;) {
        loop_once(epoll, sfd, event);
    }

    close(epoll);
    sk_on_close(epoll);

    return 0;
}